

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O3

bool __thiscall
cmGetFilenameComponentCommand::InitialPass
          (cmGetFilenameComponentCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  string *name;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  pointer pbVar9;
  uint uVar10;
  pointer pbVar11;
  string err;
  string result;
  string storeArgs;
  string filename;
  string programArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  if (uVar6 < 0x41) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  if ((((uVar6 == 0x80) &&
       (iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + 3)), iVar5 == 0)) &&
      (pcVar8 = cmMakefile::GetDefinition
                          ((this->super_cmCommand).Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start), pcVar8 != (char *)0x0)) &&
     (bVar4 = cmSystemTools::IsNOTFOUND(pcVar8), !bVar4)) {
    return true;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = pbVar11[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + pbVar11[1]._M_string_length);
  lVar7 = std::__cxx11::string::find((char *)&local_70,0x4b9f63,0);
  if (lVar7 != -1) {
    bVar4 = cmMakefile::PlatformIs64Bit((this->super_cmCommand).Makefile);
    cmSystemTools::ExpandRegistryValues(&local_70,bVar4 + KeyWOW64_32);
    lVar7 = std::__cxx11::string::find((char *)&local_70,0x4ae4b0,0);
    if (lVar7 != -1) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = pbVar11[1]._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + pbVar11[1]._M_string_length);
      cmSystemTools::ExpandRegistryValues(&local_90,KeyWOW64_64 - bVar4);
      lVar7 = std::__cxx11::string::find((char *)&local_90,0x4ae4b0,0);
      if (lVar7 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  iVar5 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2));
  if ((iVar5 == 0) ||
     (iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2)), iVar5 == 0)) {
    cmsys::SystemTools::GetFilenamePath(&local_d0,&local_70);
LAB_0029a9ac:
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_0029a9cb:
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      cmsys::SystemTools::GetFilenameName(&local_d0,&local_70);
      goto LAB_0029a9ac;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0x40 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
        uVar6 = 2;
        do {
          uVar10 = (uint)uVar6;
          iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + uVar6));
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if ((iVar5 == 0) &&
             (uVar10 = uVar10 + 1, (ulong)uVar10 < (ulong)((long)pbVar9 - (long)pbVar11 >> 5))) {
            std::__cxx11::string::_M_assign((string *)&local_90);
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar9 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar6 = (ulong)(uVar10 + 1);
        } while (uVar6 < (ulong)((long)pbVar9 - (long)pbVar11 >> 5));
      }
      cmsys::SystemTools::SplitProgramFromArgs(&local_70,&local_b0,&local_50);
      goto LAB_0029a9d8;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      cmsys::SystemTools::GetFilenameExtension(&local_d0,&local_70);
      goto LAB_0029a9ac;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_d0,&local_70);
      goto LAB_0029a9ac;
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if ((iVar5 != 0) &&
       (iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2)), iVar5 != 0)) {
      std::operator+(&local_d0,"unknown component ",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 2);
      cmCommand::SetError(&this->super_cmCommand,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
      goto LAB_0029aa3f;
    }
    pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath(&local_d0,&local_70,pcVar8);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2));
    if (iVar5 == 0) {
      cmsys::SystemTools::GetRealPath(&local_d0,&local_b0,(string *)0x0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0029a9d8;
      goto LAB_0029a9cb;
    }
  }
LAB_0029a9d8:
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 == 0x80) &&
     (iVar5 = std::__cxx11::string::compare((char *)(pbVar11 + 3)),
     _Var3._M_p = local_50._M_dataplus._M_p, iVar5 == 0)) {
    if ((local_50._M_string_length != 0) && (local_90._M_string_length != 0)) {
      pcVar2 = (this->super_cmCommand).Makefile;
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      cmMakefile::AddCacheDefinition(pcVar2,&local_90,_Var3._M_p,"",STRING - (iVar5 == 0),false);
    }
    _Var3._M_p = local_b0._M_dataplus._M_p;
    pcVar2 = (this->super_cmCommand).Makefile;
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    iVar5 = std::__cxx11::string::compare((char *)(name + 2));
    bVar4 = true;
    cmMakefile::AddCacheDefinition(pcVar2,name,_Var3._M_p,"",STRING - (iVar5 == 0),false);
  }
  else {
    if ((local_50._M_string_length != 0) && (local_90._M_string_length != 0)) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_90,local_50._M_dataplus._M_p);
    }
    bVar4 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,local_b0._M_dataplus._M_p);
  }
LAB_0029aa3f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmGetFilenameComponentCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 3)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if(args.size() == 4 && args[3] == "CACHE")
    {
    const char* cacheValue = this->Makefile->GetDefinition(args[0]);
    if(cacheValue && !cmSystemTools::IsNOTFOUND(cacheValue))
      {
      return true;
      }
    }

  std::string result;
  std::string filename = args[1];
  if(filename.find("[HKEY") != filename.npos)
    {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if(this->Makefile->PlatformIs64Bit())
      {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
      }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if(filename.find("/registry") != filename.npos)
      {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if(other.find("/registry") == other.npos)
        {
        filename = other;
        }
      }
    }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH")
    {
    result = cmSystemTools::GetFilenamePath(filename);
    }
  else if (args[2] == "NAME")
    {
    result = cmSystemTools::GetFilenameName(filename);
    }
  else if (args[2] == "PROGRAM")
    {
    for(unsigned int i=2; i < args.size(); ++i)
      {
      if(args[i] == "PROGRAM_ARGS")
        {
        i++;
        if(i < args.size())
          {
          storeArgs = args[i];
          }
        }
      }
    cmSystemTools::SplitProgramFromArgs(filename,
                                        result, programArgs);
    }
  else if (args[2] == "EXT")
    {
    result = cmSystemTools::GetFilenameExtension(filename);
    }
  else if (args[2] == "NAME_WE")
    {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
    }
  else if (args[2] == "ABSOLUTE" ||
           args[2] == "REALPATH")
    {
    // Collapse the path to its simplest form.
    // If the path given is relative evaluate it relative to the
    // current source directory.
    result = cmSystemTools::CollapseFullPath(
      filename, this->Makefile->GetCurrentSourceDirectory());
    if(args[2] == "REALPATH")
      {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
      }
    }
  else
    {
    std::string err = "unknown component " + args[2];
    this->SetError(err);
    return false;
    }

  if(args.size() == 4 && args[3] == "CACHE")
    {
    if(!programArgs.empty() && !storeArgs.empty())
      {
      this->Makefile->AddCacheDefinition
        (storeArgs, programArgs.c_str(),
         "", args[2] == "PATH" ? cmState::FILEPATH
         : cmState::STRING);
      }
    this->Makefile->AddCacheDefinition
      (args[0], result.c_str(), "",
       args[2] == "PATH" ? cmState::FILEPATH
       : cmState::STRING);
    }
  else
    {
    if(!programArgs.empty() && !storeArgs.empty())
      {
      this->Makefile->AddDefinition(storeArgs, programArgs.c_str());
      }
    this->Makefile->AddDefinition(args[0], result.c_str());
    }

  return true;
}